

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::grabKeyboard(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsItem **ppQVar2;
  QGraphicsItem *in_RSI;
  QListSpecialMethodsBase<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QEvent grabEvent;
  QEvent ungrabEvent;
  parameter_type in_stack_ffffffffffffff78;
  int line;
  QListSpecialMethodsBase<QGraphicsItem_*> *file;
  QMessageLogger *in_stack_ffffffffffffff90;
  QEvent *in_stack_ffffffffffffff98;
  QEvent *event;
  QGraphicsItem *in_stack_ffffffffffffffa0;
  QGraphicsScenePrivate *in_stack_ffffffffffffffa8;
  char local_50 [32];
  char local_30 [32];
  QGraphicsItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  local_10 = in_RSI;
  bVar1 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                    (in_RDI,(QGraphicsItem **)in_stack_ffffffffffffff78);
  if (bVar1) {
    ppQVar2 = QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff78)
    ;
    line = (int)((ulong)in_RDI >> 0x20);
    if (*ppQVar2 == local_10) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,(char *)file,line,(char *)in_stack_ffffffffffffff78);
      QMessageLogger::warning(local_30,"QGraphicsItem::grabKeyboard: already a keyboard grabber");
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,(char *)file,line,(char *)in_stack_ffffffffffffff78);
      ppQVar2 = QList<QGraphicsItem_*>::constLast
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (local_50,"QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p",
                 *ppQVar2);
    }
  }
  else {
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c649d);
    if (!bVar1) {
      in_stack_ffffffffffffffa0 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffa8 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&stack0xffffffffffffffa0,UngrabKeyboard);
      QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff78);
      sendEvent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      QEvent::~QEvent((QEvent *)&stack0xffffffffffffffa0);
    }
    QList<QGraphicsItem_*>::operator<<((QList<QGraphicsItem_*> *)in_RDI,in_stack_ffffffffffffff78);
    event = (QEvent *)&DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&stack0xffffffffffffff90,GrabKeyboard);
    sendEvent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,event);
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::grabKeyboard(QGraphicsItem *item)
{
    if (keyboardGrabberItems.contains(item)) {
        if (keyboardGrabberItems.constLast() == item)
            qWarning("QGraphicsItem::grabKeyboard: already a keyboard grabber");
        else
            qWarning("QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p",
                     keyboardGrabberItems.constLast());
        return;
    }

    // Send ungrab event to the last grabber.
    if (!keyboardGrabberItems.isEmpty()) {
        // Just send ungrab event to current grabber.
        QEvent ungrabEvent(QEvent::UngrabKeyboard);
        sendEvent(keyboardGrabberItems.constLast(), &ungrabEvent);
    }

    keyboardGrabberItems << item;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabKeyboard);
    sendEvent(item, &grabEvent);
}